

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_StrCaseNe_Test::Body
          (iu_SyntaxTest_x_iutest_x_StrCaseNe_Test *this)

{
  Fixed *pFVar1;
  char test [5];
  AssertionResult iutest_ar;
  char local_1f0 [8];
  AssertionResult local_1e8;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  builtin_strncpy(local_1f0,"host",5);
  iutest::internal::CmpHelperSTRCASENE(&local_1e8,"p","test","test",local_1f0);
  if (local_1e8.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,"test");
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x1d0,local_1e8.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
  }
  else {
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::internal::CmpHelperSTRCASENE(&local_1e8,"p","test","test",local_1f0);
    if (local_1e8.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,"test");
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x1d2,local_1e8.m_message._M_dataplus._M_p);
      local_1c0._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::internal::CmpHelperSTRCASENE(&local_1e8,"p","test","test",local_1f0);
    if (local_1e8.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,"test");
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x1d4,local_1e8.m_message._M_dataplus._M_p);
      local_1c0._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::internal::CmpHelperSTRCASENE(&local_1e8,"p","test","test",local_1f0);
    if (local_1e8.m_result != false) goto LAB_002dba4d;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,"test");
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x1d6,local_1e8.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_002dba4d:
  std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

IUTEST(SyntaxTest, StrCaseNe)
{
    const char test[] = "host";
    if( const char* p = "test" )
        IUTEST_ASSERT_STRCASENE(p, test) << p;
    if( const char* p = "test" )
        IUTEST_EXPECT_STRCASENE(p, test) << p;
    if( const char* p = "test" )
        IUTEST_INFORM_STRCASENE(p, test) << p;
    if( const char* p = "test" )
        IUTEST_ASSUME_STRCASENE(p, test) << p;
}